

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

bool s2textformat::MakePoint(string_view str,S2Point *point)

{
  VType VVar1;
  bool bVar2;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *in_RCX;
  string_view str_00;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  VType *local_28;
  long lStack_20;
  undefined8 local_18;
  
  str_00.ptr_ = (char *)str.length_;
  local_28 = (VType *)0x0;
  lStack_20 = 0;
  local_18 = 0;
  str_00.length_ = (size_type)&local_28;
  bVar2 = ParsePoints((s2textformat *)str.ptr_,str_00,in_RCX);
  if ((bVar2) && (lStack_20 - (long)local_28 == 0x18)) {
    point->c_[2] = local_28[2];
    VVar1 = local_28[1];
    point->c_[0] = *local_28;
    point->c_[1] = VVar1;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  if (local_28 != (VType *)0x0) {
    operator_delete(local_28);
  }
  return bVar2;
}

Assistant:

bool MakePoint(string_view str, S2Point* point) {
  vector<S2Point> vertices;
  if (!ParsePoints(str, &vertices) || vertices.size() != 1) return false;
  *point = vertices[0];
  return true;
}